

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcQuant.c
# Opt level: O2

Abc_Ntk_t * Abc_NtkSwapVariables(Abc_Ntk_t *pNtk)

{
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar1;
  Abc_Aig_t *pMan;
  ulong uVar2;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  ulong uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  
  uVar2 = (long)pNtk->vPis->nSize / 2;
  if (pNtk->ntkType == ABC_NTK_STRASH) {
    pAVar5 = (Abc_Obj_t *)0x3;
    pNtk_00 = Abc_NtkStartFrom(pNtk,ABC_NTK_STRASH,ABC_FUNC_AIG);
    iVar9 = (int)uVar2;
    uVar6 = 0;
    iVar8 = 0;
    if (0 < iVar9) {
      uVar6 = uVar2 & 0xffffffff;
      iVar8 = 0;
    }
    for (; (int)uVar6 != iVar8; iVar8 = iVar8 + 1) {
      pAVar3 = Abc_NtkPi(pNtk,iVar8);
      uVar7 = iVar9 + iVar8;
      pAVar5 = (Abc_Obj_t *)(ulong)uVar7;
      pAVar4 = Abc_NtkPi(pNtk,uVar7);
      aVar1 = pAVar3->field_6;
      pAVar3->field_6 = pAVar4->field_6;
      pAVar4->field_6 = aVar1;
    }
    for (uVar7 = 0; iVar8 = (int)pAVar5, (int)uVar7 < pNtk->vObjs->nSize; uVar7 = uVar7 + 1) {
      pAVar5 = (Abc_Obj_t *)(ulong)uVar7;
      pAVar3 = Abc_NtkObj(pNtk,uVar7);
      if ((pAVar3 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar3->field_0x14 & 0xf) == 7)) {
        pMan = (Abc_Aig_t *)pNtk_00->pManFunc;
        pAVar5 = Abc_ObjChild0Copy(pAVar3);
        pAVar4 = Abc_ObjChild1Copy(pAVar3);
        pAVar4 = Abc_AigAnd(pMan,pAVar5,pAVar4);
        (pAVar3->field_6).pCopy = pAVar4;
      }
    }
    pAVar5 = Abc_NtkPo(pNtk,iVar8);
    pAVar5 = Abc_ObjChild0Copy(pAVar5);
    pAVar3 = Abc_NtkPo(pNtk_00,iVar8);
    Abc_ObjAddFanin(pAVar3,pAVar5);
    return pNtk_00;
  }
  __assert_fail("Abc_NtkIsStrash(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcQuant.c"
                ,0x126,"Abc_Ntk_t *Abc_NtkSwapVariables(Abc_Ntk_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkSwapVariables( Abc_Ntk_t * pNtk )
{
    Abc_Ntk_t * pNtkNew;
    Abc_Obj_t * pMiter, * pObj, * pObj0, * pObj1;
    int i, nVars = Abc_NtkPiNum(pNtk)/2;
    assert( Abc_NtkIsStrash(pNtk) );
    // start the new network 
    pNtkNew = Abc_NtkStartFrom( pNtk, ABC_NTK_STRASH, ABC_FUNC_AIG );
    // update the PIs
    for ( i = 0; i < nVars; i++ )
    {
        pObj0 = Abc_NtkPi( pNtk, i );
        pObj1 = Abc_NtkPi( pNtk, i+nVars );
        pMiter = pObj0->pCopy;
        pObj0->pCopy = pObj1->pCopy;
        pObj1->pCopy = pMiter;
    }
    // restrash
    Abc_NtkForEachNode( pNtk, pObj, i )
        pObj->pCopy = Abc_AigAnd( (Abc_Aig_t *)pNtkNew->pManFunc, Abc_ObjChild0Copy(pObj), Abc_ObjChild1Copy(pObj) );
    // add the PO
    pMiter = Abc_ObjChild0Copy( Abc_NtkPo(pNtk,0) );
    Abc_ObjAddFanin( Abc_NtkPo(pNtkNew,0), pMiter );
    return pNtkNew;
}